

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void wasm::debug::copyDebugInfo
               (Expression *origin,Expression *copy,Function *originFunc,Function *copyFunc)

{
  undefined1 auStack_238 [8];
  Lister copyList;
  Lister originList;
  Expression *local_50;
  Expression *origin_local;
  Expression *copy_local;
  DebugLocation location;
  
  copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = origin;
  origin_local = copy;
  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)
             &copyList.list.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_50);
  auStack_238 = (undefined1  [8])0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.replacep = (Expression **)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].currp
       = (Expression **)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currFunction = (Function *)0x0
  ;
  copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
  super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule = (Module *)0x0;
  copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::walk
            ((Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_> *)auStack_238,
             &origin_local);
  if ((Module *)
      copyList.list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule) {
    __assert_fail("originList.list.size() == copyList.list.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/debug.h"
                  ,0x2b,
                  "void wasm::debug::copyDebugInfo(Expression *, Expression *, Function *, Function *)"
                 );
  }
  if (copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule !=
      (Module *)0x0) {
    operator_delete(copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                    .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.currModule,
                    (long)copyList.list.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)copyList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          currModule);
  }
  if (copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
      super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed._M_elems[9].
      currp != (Expression **)0x0) {
    operator_delete(copyList.super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>
                    .super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.fixed
                    ._M_elems[9].currp,
                    (long)copyList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          flexible.
                          super__Vector_base<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task,_std::allocator<wasm::Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)copyList.
                          super_PostWalker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.
                          super_Walker<Lister,_wasm::UnifiedExpressionVisitor<Lister,_void>_>.stack.
                          fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

inline void copyDebugInfo(Expression* origin,
                          Expression* copy,
                          Function* originFunc,
                          Function* copyFunc) {
  struct Lister : public PostWalker<Lister, UnifiedExpressionVisitor<Lister>> {
    std::vector<Expression*> list;
    void visitExpression(Expression* curr) { list.push_back(curr); }
  };

  Lister originList;
  originList.walk(origin);
  Lister copyList;
  copyList.walk(copy);

  auto& originDebug = originFunc->debugLocations;
  auto& copyDebug = copyFunc->debugLocations;

  assert(originList.list.size() == copyList.list.size());
  for (Index i = 0; i < originList.list.size(); i++) {
    auto iter = originDebug.find(originList.list[i]);
    if (iter != originDebug.end()) {
      auto location = iter->second;
      copyDebug[copyList.list[i]] = location;
    }
  }
}